

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

N_Vector SUNLinSolResid(SUNLinearSolver S)

{
  _func_N_Vector_SUNLinearSolver *UNRECOVERED_JUMPTABLE;
  N_Vector p_Var1;
  
  UNRECOVERED_JUMPTABLE = S->ops->resid;
  if (UNRECOVERED_JUMPTABLE != (_func_N_Vector_SUNLinearSolver *)0x0) {
    p_Var1 = (*UNRECOVERED_JUMPTABLE)(S);
    return p_Var1;
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector SUNLinSolResid(SUNLinearSolver S)
{
  N_Vector resid;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->resid)
    resid = S->ops->resid(S);
  else
    resid = NULL;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(resid);
}